

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O1

void __thiscall S2Polyline::Encode(S2Polyline *this,Encoder *encoder)

{
  uchar *puVar1;
  size_t __n;
  S2LogMessage local_20;
  
  Encoder::Ensure(encoder,(long)this->num_vertices_ * 0x18 + 10);
  Encoder::put8(encoder,'\x01');
  Encoder::put32(encoder,this->num_vertices_);
  __n = (long)this->num_vertices_ * 0x18;
  memcpy(encoder->buf_,
         (this->vertices_)._M_t.
         super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
         super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
         super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl,__n);
  puVar1 = encoder->buf_;
  encoder->buf_ = puVar1 + __n;
  if (puVar1 + __n <= encoder->limit_) {
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
             ,0xf8,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_20.stream_,"Check failed: (limit_) >= (buf_) ",0x21);
  abort();
}

Assistant:

void S2Polyline::Encode(Encoder* const encoder) const {
  encoder->Ensure(num_vertices_ * sizeof(vertices_[0]) + 10);  // sufficient

  encoder->put8(kCurrentLosslessEncodingVersionNumber);
  encoder->put32(num_vertices_);
  encoder->putn(&vertices_[0], sizeof(vertices_[0]) * num_vertices_);

  S2_DCHECK_GE(encoder->avail(), 0);
}